

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SimpleDateFormat::matchString
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UCalendarDateFields field,
          UnicodeString *data,int32_t dataCount,UnicodeString *monthPattern,Calendar *cal)

{
  ulong uVar1;
  int32_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  UnicodeString *data_00;
  UCalendarDateFields field_00;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int32_t local_118;
  UErrorCode status;
  UObject local_108;
  long local_100;
  UnicodeString leapMonthName;
  UnicodeString bestMatchName;
  SimpleFormatter local_78;
  
  local_108._vptr_UObject = (_func_int **)&PTR__UnicodeString_00471e80;
  bestMatchName.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_00471e80;
  bestMatchName.fUnion.fStackFields.fLengthAndFlags = 2;
  local_100 = (long)dataCount;
  data_00 = data + (field == UCAL_DAY_OF_WEEK);
  uVar7 = 0xffffffffffffffff;
  iVar5 = 0;
  local_118 = 0;
  for (uVar4 = (ulong)(field == UCAL_DAY_OF_WEEK); (long)uVar4 < local_100; uVar4 = uVar4 + 1) {
    iVar2 = matchStringWithOptionalDot(text,start,data_00);
    uVar1 = uVar7;
    if (iVar5 < iVar2) {
      uVar1 = uVar4;
      iVar5 = iVar2;
    }
    uVar7 = uVar1 & 0xffffffff;
    if (monthPattern != (UnicodeString *)0x0) {
      status = U_ZERO_ERROR;
      leapMonthName.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)(UObject)local_108._vptr_UObject;
      leapMonthName.fUnion.fStackFields.fLengthAndFlags = 2;
      SimpleFormatter::SimpleFormatter(&local_78,monthPattern,1,1,&status);
      SimpleFormatter::format(&local_78,data_00,&leapMonthName,&status);
      SimpleFormatter::~SimpleFormatter(&local_78);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar2 = matchStringWithOptionalDot(text,start,&leapMonthName);
        uVar7 = uVar1 & 0xffffffff;
        if (iVar5 < iVar2) {
          uVar7 = uVar4 & 0xffffffff;
          local_118 = 1;
          iVar5 = iVar2;
        }
      }
      else {
        uVar7 = uVar1 & 0xffffffff;
      }
      icu_63::UnicodeString::~UnicodeString(&leapMonthName);
    }
    data_00 = data_00 + 1;
  }
  iVar6 = (int)uVar7;
  if (iVar6 < 0) {
    iVar2 = -start;
  }
  else {
    if ((int)field < 0x17) {
      iVar3 = (*(cal->super_UObject)._vptr_UObject[0x17])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"hebrew");
      field_00 = UCAL_MONTH;
      if (iVar6 != 0xd || (field != UCAL_MONTH || iVar3 != 0)) {
        field_00 = field;
      }
      iVar2 = 6;
      if (iVar6 != 0xd || (field != UCAL_MONTH || iVar3 != 0)) {
        iVar2 = (uint)(field == UCAL_YEAR) + iVar6;
      }
      Calendar::set(cal,field_00,iVar2);
      if (monthPattern != (UnicodeString *)0x0) {
        Calendar::set(cal,UCAL_IS_LEAP_MONTH,local_118);
      }
    }
    iVar2 = iVar5 + start;
  }
  icu_63::UnicodeString::~UnicodeString(&bestMatchName);
  return iVar2;
}

Assistant:

int32_t SimpleDateFormat::matchString(const UnicodeString& text,
                              int32_t start,
                              UCalendarDateFields field,
                              const UnicodeString* data,
                              int32_t dataCount,
                              const UnicodeString* monthPattern,
                              Calendar& cal) const
{
    int32_t i = 0;
    int32_t count = dataCount;

    if (field == UCAL_DAY_OF_WEEK) i = 1;

    // There may be multiple strings in the data[] array which begin with
    // the same prefix (e.g., Cerven and Cervenec (June and July) in Czech).
    // We keep track of the longest match, and return that.  Note that this
    // unfortunately requires us to test all array elements.
    int32_t bestMatchLength = 0, bestMatch = -1;
    UnicodeString bestMatchName;
    int32_t isLeapMonth = 0;

    for (; i < count; ++i) {
        int32_t matchLen = 0;
        if ((matchLen = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatch = i;
            bestMatchLength = matchLen;
        }

        if (monthPattern != NULL) {
            UErrorCode status = U_ZERO_ERROR;
            UnicodeString leapMonthName;
            SimpleFormatter(*monthPattern, 1, 1, status).format(data[i], leapMonthName, status);
            if (U_SUCCESS(status)) {
                if ((matchLen = matchStringWithOptionalDot(text, start, leapMonthName)) > bestMatchLength) {
                    bestMatch = i;
                    bestMatchLength = matchLen;
                    isLeapMonth = 1;
                }
            }
        }
    }

    if (bestMatch >= 0) {
        if (field < UCAL_FIELD_COUNT) {
            // Adjustment for Hebrew Calendar month Adar II
            if (!strcmp(cal.getType(),"hebrew") && field==UCAL_MONTH && bestMatch==13) {
                cal.set(field,6);
            } else {
                if (field == UCAL_YEAR) {
                    bestMatch++; // only get here for cyclic year names, which match 1-based years 1-60
                }
                cal.set(field, bestMatch);
            }
            if (monthPattern != NULL) {
                cal.set(UCAL_IS_LEAP_MONTH, isLeapMonth);
            }
        }

        return start + bestMatchLength;
    }

    return -start;
}